

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void getPixelColorsRGB8(uchar *buffer,size_t numpixels,uchar *in,LodePNGColorMode *mode)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uchar *puVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  
  switch(mode->colortype) {
  case LCT_GREY:
    uVar3 = mode->bitdepth;
    uVar4 = (ulong)uVar3;
    if (uVar4 == 8) {
      if (numpixels != 0) {
        puVar9 = buffer + 2;
        sVar5 = 0;
        do {
          uVar2 = in[sVar5];
          *puVar9 = uVar2;
          puVar9[-1] = uVar2;
          puVar9[-2] = uVar2;
          sVar5 = sVar5 + 1;
          puVar9 = puVar9 + 3;
        } while (numpixels != sVar5);
      }
    }
    else if (uVar3 == 0x10) {
      if (numpixels != 0) {
        puVar9 = buffer + 2;
        sVar5 = 0;
        do {
          uVar2 = in[sVar5 * 2];
          *puVar9 = uVar2;
          puVar9[-1] = uVar2;
          puVar9[-2] = uVar2;
          sVar5 = sVar5 + 1;
          puVar9 = puVar9 + 3;
        } while (numpixels != sVar5);
      }
    }
    else if (numpixels != 0) {
      sVar5 = 0;
      uVar10 = 0;
      do {
        if (uVar3 == 0) {
          uVar11 = 0;
        }
        else {
          iVar8 = 0;
          uVar7 = uVar4;
          uVar12 = uVar10;
          do {
            uVar13 = uVar12 >> 3;
            bVar1 = (byte)uVar12;
            uVar12 = uVar12 + 1;
            iVar8 = (uint)((in[uVar13] >> (~bVar1 & 7) & 1) != 0) + iVar8 * 2;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
          uVar10 = uVar10 + uVar4;
          uVar11 = iVar8 * 0xff;
        }
        uVar2 = (uchar)(uVar11 / (uint)~(-1 << ((byte)uVar3 & 0x1f)));
        buffer[2] = uVar2;
        buffer[1] = uVar2;
        *buffer = uVar2;
        sVar5 = sVar5 + 1;
        buffer = buffer + 3;
      } while (sVar5 != numpixels);
    }
    break;
  case LCT_RGB:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        memcpy(buffer,in,numpixels * 3);
        return;
      }
    }
    else if (numpixels != 0) {
      lVar6 = 0;
      do {
        buffer[lVar6] = in[lVar6 * 2];
        buffer[lVar6 + 1] = in[lVar6 * 2 + 2];
        buffer[lVar6 + 2] = in[lVar6 * 2 + 4];
        lVar6 = lVar6 + 3;
        numpixels = numpixels - 1;
      } while (numpixels != 0);
    }
    break;
  case LCT_PALETTE:
    uVar3 = mode->bitdepth;
    uVar4 = (ulong)uVar3;
    if (uVar4 == 8) {
      if (numpixels != 0) {
        puVar9 = mode->palette;
        sVar5 = 0;
        do {
          bVar1 = in[sVar5];
          buffer[2] = puVar9[(ulong)bVar1 * 4 + 2];
          *(undefined2 *)buffer = *(undefined2 *)(puVar9 + (ulong)bVar1 * 4);
          sVar5 = sVar5 + 1;
          buffer = buffer + 3;
        } while (numpixels != sVar5);
      }
    }
    else if (numpixels != 0) {
      puVar9 = mode->palette;
      sVar5 = 0;
      uVar10 = 0;
      do {
        uVar13 = 0;
        uVar7 = uVar10;
        uVar12 = uVar4;
        if (uVar3 != 0) {
          do {
            uVar11 = (uint)((in[uVar7 >> 3] >> (~(byte)uVar7 & 7) & 1) != 0) + (int)uVar13 * 2;
            uVar13 = (ulong)uVar11;
            uVar12 = uVar12 - 1;
            uVar7 = uVar7 + 1;
          } while (uVar12 != 0);
          uVar10 = uVar10 + uVar4;
          uVar13 = (ulong)(uVar11 * 4);
        }
        buffer[2] = puVar9[uVar13 + 2];
        *(undefined2 *)buffer = *(undefined2 *)(puVar9 + uVar13);
        sVar5 = sVar5 + 1;
        buffer = buffer + 3;
      } while (sVar5 != numpixels);
    }
    break;
  case LCT_GREY_ALPHA:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        puVar9 = buffer + 2;
        sVar5 = 0;
        do {
          uVar2 = in[sVar5 * 2];
          *puVar9 = uVar2;
          puVar9[-1] = uVar2;
          puVar9[-2] = uVar2;
          sVar5 = sVar5 + 1;
          puVar9 = puVar9 + 3;
        } while (numpixels != sVar5);
      }
    }
    else if (numpixels != 0) {
      puVar9 = buffer + 2;
      sVar5 = 0;
      do {
        uVar2 = in[sVar5 * 4];
        *puVar9 = uVar2;
        puVar9[-1] = uVar2;
        puVar9[-2] = uVar2;
        sVar5 = sVar5 + 1;
        puVar9 = puVar9 + 3;
      } while (numpixels != sVar5);
    }
    break;
  case LCT_RGBA:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        sVar5 = 0;
        do {
          buffer[2] = in[sVar5 * 4 + 2];
          *(undefined2 *)buffer = *(undefined2 *)(in + sVar5 * 4);
          sVar5 = sVar5 + 1;
          buffer = buffer + 3;
        } while (numpixels != sVar5);
      }
    }
    else if (numpixels != 0) {
      sVar5 = 0;
      do {
        *buffer = in[sVar5 * 8];
        buffer[1] = in[sVar5 * 8 + 2];
        buffer[2] = in[sVar5 * 8 + 4];
        sVar5 = sVar5 + 1;
        buffer = buffer + 3;
      } while (numpixels != sVar5);
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGB8(unsigned char* LODEPNG_RESTRICT buffer, size_t numpixels,
                               const unsigned char* LODEPNG_RESTRICT in,
                               const LodePNGColorMode* mode) {
  const unsigned num_channels = 3;
  size_t i;
  if(mode->colortype == LCT_GREY) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i];
      }
    } else if(mode->bitdepth == 16) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2];
      }
    } else {
      unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
      size_t j = 0;
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
        buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
      }
    }
  } else if(mode->colortype == LCT_RGB) {
    if(mode->bitdepth == 8) {
      lodepng_memcpy(buffer, in, numpixels * 3);
    } else {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = in[i * 6 + 0];
        buffer[1] = in[i * 6 + 2];
        buffer[2] = in[i * 6 + 4];
      }
    }
  } else if(mode->colortype == LCT_PALETTE) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned index = in[i];
        /*out of bounds of palette not checked: see lodepng_color_mode_alloc_palette.*/
        lodepng_memcpy(buffer, &mode->palette[index * 4], 3);
      }
    } else {
      size_t j = 0;
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned index = readBitsFromReversedStream(&j, in, mode->bitdepth);
        /*out of bounds of palette not checked: see lodepng_color_mode_alloc_palette.*/
        lodepng_memcpy(buffer, &mode->palette[index * 4], 3);
      }
    }
  } else if(mode->colortype == LCT_GREY_ALPHA) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
      }
    } else {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
      }
    }
  } else if(mode->colortype == LCT_RGBA) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        lodepng_memcpy(buffer, &in[i * 4], 3);
      }
    } else {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = in[i * 8 + 0];
        buffer[1] = in[i * 8 + 2];
        buffer[2] = in[i * 8 + 4];
      }
    }
  }
}